

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allreduce.h
# Opt level: O1

void __thiscall node_socks::node_socks(node_socks *this)

{
  (this->current_master)._M_dataplus._M_p = (pointer)&(this->current_master).field_2;
  (this->current_master)._M_string_length = 0;
  (this->current_master).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_replace((ulong)this,0,(char *)0x0,0x280562);
  return;
}

Assistant:

node_socks() { current_master = ""; }